

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

void crnlib::LenEnc_Init(CLenEnc *p)

{
  uint local_14;
  uint i;
  CLenEnc *p_local;
  
  p->choice2 = 0x400;
  p->choice = 0x400;
  for (local_14 = 0; local_14 < 0x80; local_14 = local_14 + 1) {
    p->low[local_14] = 0x400;
  }
  for (local_14 = 0; local_14 < 0x80; local_14 = local_14 + 1) {
    p->mid[local_14] = 0x400;
  }
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    p->high[local_14] = 0x400;
  }
  return;
}

Assistant:

static void LenEnc_Init(CLenEnc* p) {
  unsigned i;
  p->choice = p->choice2 = kProbInitValue;
  for (i = 0; i < (LZMA_NUM_PB_STATES_MAX << kLenNumLowBits); i++)
    p->low[i] = kProbInitValue;
  for (i = 0; i < (LZMA_NUM_PB_STATES_MAX << kLenNumMidBits); i++)
    p->mid[i] = kProbInitValue;
  for (i = 0; i < kLenNumHighSymbols; i++)
    p->high[i] = kProbInitValue;
}